

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::DescribeTo
          (ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
           *this,ostream *os)

{
  size_t sVar1;
  MatcherBase<const_unsigned_int_&> *this_00;
  ostream *poVar2;
  ostream *in_RSI;
  long in_RDI;
  size_t i;
  ostream *in_stack_ffffffffffffffb8;
  ostream *os_00;
  MatcherBase<const_unsigned_int_&> *in_stack_ffffffffffffffc0;
  ulong local_30;
  Message *in_stack_ffffffffffffffd8;
  ostream *in_stack_ffffffffffffffe0;
  ostream local_18 [8];
  ostream *local_10;
  
  local_10 = in_RSI;
  sVar1 = count((ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                 *)0x9c19fd);
  if (sVar1 == 0) {
    std::operator<<(local_10,"is empty");
  }
  else {
    sVar1 = count((ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                   *)0x9c1a23);
    if (sVar1 == 1) {
      std::operator<<(local_10,"has 1 element that ");
      std::
      vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
      ::operator[]((vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                    *)(in_RDI + 8),0);
      MatcherBase<const_unsigned_int_&>::DescribeTo
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      std::operator<<(local_10,"has ");
      count((ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
             *)0x9c1a7e);
      os_00 = local_18;
      Elements((size_t)in_stack_ffffffffffffffd8);
      this_00 = (MatcherBase<const_unsigned_int_&> *)
                testing::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      std::operator<<((ostream *)this_00," where\n");
      Message::~Message((Message *)0x9c1ac3);
      for (local_30 = 0;
          sVar1 = count((ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                         *)0x9c1ae0), local_30 != sVar1; local_30 = local_30 + 1) {
        poVar2 = std::operator<<(local_10,"element #");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
        std::operator<<(poVar2," ");
        std::
        vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
        ::operator[]((vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                      *)(in_RDI + 8),local_30);
        MatcherBase<const_unsigned_int_&>::DescribeTo(this_00,os_00);
        sVar1 = count((ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                       *)0x9c1b56);
        if (local_30 + 1 < sVar1) {
          std::operator<<(local_10,",\n");
        }
      }
    }
  }
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "is empty";
    } else if (count() == 1) {
      *os << "has 1 element that ";
      matchers_[0].DescribeTo(os);
    } else {
      *os << "has " << Elements(count()) << " where\n";
      for (size_t i = 0; i != count(); ++i) {
        *os << "element #" << i << " ";
        matchers_[i].DescribeTo(os);
        if (i + 1 < count()) {
          *os << ",\n";
        }
      }
    }
  }